

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCatalogPI(xmlParserCtxtPtr ctxt,xmlChar *catalog)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  xmlChar *URL;
  void *pvVar4;
  xmlChar *in_R8;
  byte *pbVar5;
  byte *pbVar6;
  
  pbVar6 = catalog;
  while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
  }
  iVar2 = xmlStrncmp(pbVar6,"catalog",7);
  if (iVar2 == 0) {
    pbVar6 = pbVar6 + 9;
    while( true ) {
      uVar3 = (ulong)pbVar6[-2];
      if (0x3d < uVar3) {
        return;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar6 = pbVar6 + 1;
    }
    if (uVar3 != 0x3d) {
      return;
    }
    while( true ) {
      uVar3 = (ulong)pbVar6[-1];
      if (0x27 < uVar3) break;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x8400000000U >> (uVar3 & 0x3f) & 1) != 0) {
          iVar2 = -1;
          pbVar5 = pbVar6;
          goto LAB_001607ac;
        }
        break;
      }
      pbVar6 = pbVar6 + 1;
    }
  }
  goto LAB_0016071a;
  while (bVar1 != pbVar6[-1]) {
LAB_001607ac:
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    iVar2 = iVar2 + 1;
    if (bVar1 == 0) break;
  }
  if (bVar1 != 0) {
    URL = xmlStrndup(pbVar6,iVar2);
    for (; uVar3 = (ulong)*pbVar5, uVar3 < 0x21; pbVar5 = pbVar5 + 1) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0) {
          if (URL == (xmlChar *)0x0) {
            return;
          }
          pvVar4 = xmlCatalogAddLocal(ctxt->catalogs,URL);
          ctxt->catalogs = pvVar4;
          goto LAB_0016073d;
        }
        break;
      }
    }
    goto LAB_0016071d;
  }
LAB_0016071a:
  URL = (xmlChar *)0x0;
LAB_0016071d:
  xmlWarningMsg(ctxt,XML_WAR_CATALOG_PI,"Catalog PI syntax error: %s\n",catalog,in_R8);
  if (URL == (xmlChar *)0x0) {
    return;
  }
LAB_0016073d:
  (*xmlFree)(URL);
  return;
}

Assistant:

static void
xmlParseCatalogPI(xmlParserCtxtPtr ctxt, const xmlChar *catalog) {
    xmlChar *URL = NULL;
    const xmlChar *tmp, *base;
    xmlChar marker;

    tmp = catalog;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (xmlStrncmp(tmp, BAD_CAST"catalog", 7))
	goto error;
    tmp += 7;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (*tmp != '=') {
	return;
    }
    tmp++;
    while (IS_BLANK_CH(*tmp)) tmp++;
    marker = *tmp;
    if ((marker != '\'') && (marker != '"'))
	goto error;
    tmp++;
    base = tmp;
    while ((*tmp != 0) && (*tmp != marker)) tmp++;
    if (*tmp == 0)
	goto error;
    URL = xmlStrndup(base, tmp - base);
    tmp++;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (*tmp != 0)
	goto error;

    if (URL != NULL) {
	ctxt->catalogs = xmlCatalogAddLocal(ctxt->catalogs, URL);
	xmlFree(URL);
    }
    return;

error:
    xmlWarningMsg(ctxt, XML_WAR_CATALOG_PI,
	          "Catalog PI syntax error: %s\n",
		  catalog, NULL);
    if (URL != NULL)
	xmlFree(URL);
}